

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cxx
# Opt level: O0

void __thiscall cxx03_digest_test::test_method(cxx03_digest_test *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_98;
  basic_cstring<const_char> local_70 [2];
  basic_cstring<const_char> local_50;
  cryptox local_40 [8];
  string str;
  undefined1 local_20 [8];
  digest_type hash;
  cxx03_digest_test *this_local;
  
  hash._M_elems._8_8_ = this;
  _local_20 = cryptox::digest<cryptox::message_digest_algorithm<&EVP_md5,128ul>>("Hello world!");
  cryptox::to_hex<std::array<unsigned_char,16ul>>(local_40,(array<unsigned_char,_16UL> *)local_20);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_50,0x1d,local_70);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_98,prev,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
               ,0x75);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
              (&local_98,&local_a8,0x1d,1,2,local_40,"str","86fb269d190d2c85f6e0468ceca42a20",
               "\"86fb269d190d2c85f6e0468ceca42a20\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(cxx03_digest_test) {
	const md5::digest_type hash = digest<md5>("Hello world!");
	const std::string str = to_hex(hash);
	BOOST_CHECK_EQUAL(str, "86fb269d190d2c85f6e0468ceca42a20");
}